

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  undefined8 uVar5;
  SDL_Window *screen_00;
  long lVar6;
  string *fname;
  long lVar7;
  undefined8 *in_RSI;
  int in_EDI;
  bool bVar8;
  bool force_redraw;
  __enable_if_is_duration<std::chrono::duration<long>_> end_time;
  __enable_if_is_duration<std::chrono::duration<long>_> cur_time;
  int have_evt;
  SDL_Event event;
  seconds last_time;
  EomAction eom_action;
  int fileidx;
  ALCdevice *device;
  Uint32 i;
  bool ok;
  SDL_RendererInfo rinf;
  SDL_Renderer *renderer;
  Uint32 render_flags;
  SDL_Window *screen;
  unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
  movState;
  undefined4 in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffc4c;
  unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
  *in_stack_fffffffffffffc50;
  undefined7 in_stack_fffffffffffffc60;
  undefined1 in_stack_fffffffffffffc67;
  char ***in_stack_fffffffffffffc68;
  string *in_stack_fffffffffffffc78;
  uint in_stack_fffffffffffffc80;
  uint in_stack_fffffffffffffc84;
  MovieState *in_stack_fffffffffffffca8;
  PrettyTime *in_stack_fffffffffffffce8;
  ostream *in_stack_fffffffffffffcf0;
  undefined7 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcff;
  MovieState *in_stack_fffffffffffffd00;
  byte local_2e1;
  SDL_Renderer *in_stack_fffffffffffffe18;
  VideoState *in_stack_fffffffffffffe28;
  allocator local_199;
  string local_198 [32];
  unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
  local_178;
  rep local_170;
  undefined1 local_161;
  rep local_160;
  rep local_158;
  rep local_150;
  rep local_148;
  rep local_140;
  rep local_138;
  int local_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  rep local_e8;
  int local_e0;
  undefined1 local_da;
  allocator local_d9;
  string local_d8 [32];
  PrettyTime local_b8;
  int local_ac;
  undefined8 local_a8;
  uint local_a0;
  byte local_99;
  char *local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  long local_40;
  undefined4 local_34;
  SDL_Window *local_30;
  undefined4 local_28;
  ostream local_18 [8];
  undefined8 *local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::
  unique_ptr<(anonymous_namespace)::MovieState,std::default_delete<(anonymous_namespace)::MovieState>>
  ::unique_ptr<std::default_delete<(anonymous_namespace)::MovieState>,void>
            (in_stack_fffffffffffffc50);
  if (local_8 < 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar3 = std::operator<<(poVar3,(char *)*local_10);
    poVar3 = std::operator<<(poVar3," [-device <device name>] [-direct] <files...>");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    avformat_network_init();
    iVar2 = SDL_Init(0x4020);
    if (iVar2 == 0) {
      uVar5 = std::__cxx11::string::c_str();
      screen_00 = (SDL_Window *)SDL_CreateWindow(uVar5,0,0,0x280,0x1e0,0x20);
      local_30 = screen_00;
      if (screen_00 == (SDL_Window *)0x0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"SDL: could not set video mode - exiting");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        local_34 = 6;
        lVar6 = SDL_CreateRenderer(screen_00,0xffffffff,6);
        local_40 = lVar6;
        if (lVar6 != 0) {
          local_58 = 0;
          uStack_50 = 0;
          local_68 = 0;
          uStack_60 = 0;
          local_78 = 0;
          uStack_70 = 0;
          local_88 = 0;
          uStack_80 = 0;
          local_98 = (char *)0x0;
          uStack_90 = 0;
          local_48 = 0;
          local_99 = 0;
          iVar2 = SDL_GetRendererInfo(lVar6,&local_98);
          if (iVar2 == 0) {
            local_a0 = 0;
            while( true ) {
              bVar8 = false;
              if ((local_99 & 1) == 0) {
                bVar8 = local_a0 < uStack_90._4_4_;
              }
              if (!bVar8) break;
              local_99 = *(int *)((long)&local_88 + (ulong)local_a0 * 4) == 0x56555949;
              local_a0 = local_a0 + 1;
            }
          }
          if ((local_99 & 1) == 0) {
            poVar3 = std::operator<<((ostream *)&std::cerr,
                                     "IYUV pixelformat textures not supported on renderer ");
            poVar3 = std::operator<<(poVar3,local_98);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            SDL_DestroyRenderer(local_40);
            local_40 = 0;
          }
        }
        if (local_40 == 0) {
          local_34 = 5;
          local_40 = SDL_CreateRenderer(local_30,0xffffffff,5);
        }
        if (local_40 == 0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"SDL: could not create renderer - exiting")
          ;
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        else {
          SDL_SetRenderDrawColor(local_40,0,0,0,0xff);
          SDL_RenderFillRect(local_40,0);
          SDL_RenderPresent(local_40);
          local_10 = local_10 + 1;
          local_8 = local_8 + -1;
          iVar2 = InitAL(in_stack_fffffffffffffc68,
                         (int *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60));
          if (iVar2 == 0) {
            uVar5 = alcGetCurrentContext();
            local_a8 = alcGetContextsDevice(uVar5);
            cVar1 = alcIsExtensionPresent(local_a8,"ALC_SOFT_device_clock");
            if (cVar1 != '\0') {
              poVar3 = std::operator<<((ostream *)&std::cout,"Found ALC_SOFT_device_clock");
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
              (anonymous_namespace)::alcGetInteger64vSOFT =
                   alcGetProcAddress(local_a8,"alcGetInteger64vSOFT");
            }
            cVar1 = alIsExtensionPresent("AL_SOFT_source_latency");
            if (cVar1 != '\0') {
              poVar3 = std::operator<<((ostream *)&std::cout,"Found AL_SOFT_source_latency");
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
              (anonymous_namespace)::alGetSourcei64vSOFT = alGetProcAddress("alGetSourcei64vSOFT");
            }
            cVar1 = alIsExtensionPresent("AL_SOFT_events");
            if (cVar1 != '\0') {
              poVar3 = std::operator<<((ostream *)&std::cout,"Found AL_SOFT_events");
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
              (anonymous_namespace)::alEventControlSOFT = alGetProcAddress("alEventControlSOFT");
              (anonymous_namespace)::alEventCallbackSOFT = alGetProcAddress("alEventCallbackSOFT");
            }
            cVar1 = alIsExtensionPresent("AL_SOFTX_callback_buffer");
            if (cVar1 != '\0') {
              poVar3 = std::operator<<((ostream *)&std::cout,"Found AL_SOFT_callback_buffer");
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
              (anonymous_namespace)::alBufferCallbackSOFT = alGetProcAddress("alBufferCallbackSOFT")
              ;
            }
            for (local_ac = 0; local_ac < local_8; local_ac = local_ac + 1) {
              iVar2 = strcmp((char *)local_10[local_ac],"-direct");
              if (iVar2 == 0) {
                cVar1 = alIsExtensionPresent("AL_SOFT_direct_channels_remix");
                if (cVar1 == '\0') {
                  cVar1 = alIsExtensionPresent("AL_SOFT_direct_channels");
                  if (cVar1 == '\0') {
                    poVar3 = std::operator<<((ostream *)&std::cerr,
                                             "AL_SOFT_direct_channels not supported for direct output"
                                            );
                    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                  }
                  else {
                    poVar3 = std::operator<<((ostream *)&std::cout,"Found AL_SOFT_direct_channels");
                    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                    (anonymous_namespace)::DirectOutMode = 1;
                  }
                }
                else {
                  poVar3 = std::operator<<((ostream *)&std::cout,
                                           "Found AL_SOFT_direct_channels_remix");
                  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                  (anonymous_namespace)::DirectOutMode = 2;
                }
              }
              else {
                iVar2 = strcmp((char *)local_10[local_ac],"-wide");
                if (iVar2 == 0) {
                  cVar1 = alIsExtensionPresent("AL_EXT_STEREO_ANGLES");
                  if (cVar1 == '\0') {
                    poVar3 = std::operator<<((ostream *)&std::cerr,
                                             "AL_EXT_STEREO_ANGLES not supported for wide stereo");
                    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                  }
                  else {
                    poVar3 = std::operator<<((ostream *)&std::cout,"Found AL_EXT_STEREO_ANGLES");
                    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                    (anonymous_namespace)::EnableWideStereo = 1;
                  }
                }
                else {
                  iVar2 = strcmp((char *)local_10[local_ac],"-novideo");
                  if (iVar2 != 0) break;
                  (anonymous_namespace)::DisableVideo = 1;
                }
              }
            }
            while( true ) {
              local_2e1 = 0;
              if (local_ac < local_8) {
                bVar8 = std::unique_ptr::operator_cast_to_bool
                                  ((unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                    *)0x10d53f);
                local_2e1 = bVar8 ^ 0xff;
              }
              if ((local_2e1 & 1) == 0) break;
              operator_new(0x5c0);
              local_da = 1;
              lVar7 = (long)local_ac;
              local_ac = local_ac + 1;
              in_stack_fffffffffffffd00 = (MovieState *)local_10[lVar7];
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_d8,(char *)in_stack_fffffffffffffd00,&local_d9);
              anon_unknown.dwarf_f6f6::MovieState::MovieState
                        ((MovieState *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80)
                         ,in_stack_fffffffffffffc78);
              local_da = 0;
              in_stack_fffffffffffffce8 = &local_b8;
              std::
              unique_ptr<(anonymous_namespace)::MovieState,std::default_delete<(anonymous_namespace)::MovieState>>
              ::unique_ptr<std::default_delete<(anonymous_namespace)::MovieState>,void>
                        (in_stack_fffffffffffffc50,
                         (pointer)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
              in_stack_fffffffffffffcf0 = local_18;
              std::
              unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
              ::operator=(in_stack_fffffffffffffc50,
                          (unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                           *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
              std::
              unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
              ::~unique_ptr(in_stack_fffffffffffffc50);
              std::__cxx11::string::~string(local_d8);
              std::allocator<char>::~allocator((allocator<char> *)&local_d9);
              std::
              unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
              ::operator->((unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                            *)0x10d65c);
              in_stack_fffffffffffffcff =
                   anon_unknown.dwarf_f6f6::MovieState::prepare(in_stack_fffffffffffffca8);
              if (!(bool)in_stack_fffffffffffffcff) {
                std::
                unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                ::operator=(in_stack_fffffffffffffc50,
                            (nullptr_t)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48)
                           );
              }
            }
            bVar8 = std::unique_ptr::operator_cast_to_bool
                              ((unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                *)0x10d706);
            if (bVar8) {
              std::
              unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
              ::operator->((unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                            *)0x10d765);
              anon_unknown.dwarf_f6f6::MovieState::setTitle
                        (in_stack_fffffffffffffd00,
                         (SDL_Window *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8)
                        );
              local_e0 = 0;
              local_e8 = -0x8000000000000000;
              do {
                local_108 = 0;
                uStack_100 = 0;
                local_118 = 0;
                uStack_110 = 0;
                local_128 = 0;
                uStack_120 = 0;
                local_f8 = 0;
                local_12c = SDL_WaitEventTimeout(&local_128,10);
                std::
                unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                ::operator->((unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                              *)0x10d7f0);
                local_140 = (rep)anon_unknown.dwarf_f6f6::MovieState::getMasterClock
                                           ((MovieState *)
                                            CONCAT44(in_stack_fffffffffffffc4c,
                                                     in_stack_fffffffffffffc48));
                local_138 = (rep)std::chrono::
                                 duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                           ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                            CONCAT44(in_stack_fffffffffffffc4c,
                                                     in_stack_fffffffffffffc48));
                bVar8 = std::chrono::operator!=
                                  ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffc50,
                                   (duration<long,_std::ratio<1L,_1L>_> *)
                                   CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
                if (bVar8) {
                  std::
                  unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                  ::operator->((unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                *)0x10d86e);
                  local_150 = (rep)anon_unknown.dwarf_f6f6::MovieState::getDuration
                                             ((MovieState *)
                                              CONCAT44(in_stack_fffffffffffffc4c,
                                                       in_stack_fffffffffffffc48));
                  local_148 = (rep)std::chrono::
                                   duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                             ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                              CONCAT44(in_stack_fffffffffffffc4c,
                                                       in_stack_fffffffffffffc48));
                  in_stack_fffffffffffffca8 =
                       (MovieState *)std::operator<<((ostream *)&std::cout,"    \r ");
                  local_158 = local_138;
                  poVar3 = anon_unknown.dwarf_f6f6::operator<<
                                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
                  std::operator<<(poVar3," / ");
                  local_160 = local_148;
                  poVar3 = anon_unknown.dwarf_f6f6::operator<<
                                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
                  std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
                  local_e8 = local_138;
                }
                local_161 = 0;
                iVar2 = local_12c;
                while (iVar2 != 0) {
                  if ((int)local_128 == 0x100) {
                    std::
                    unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                    ::operator->((unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                  *)0x10daa2);
                    std::atomic<bool>::operator=
                              ((atomic<bool> *)in_stack_fffffffffffffc50,
                               SUB41((uint)in_stack_fffffffffffffc4c >> 0x18,0));
                    local_e0 = 1;
                  }
                  else if ((int)local_128 == 0x200) {
                    uStack_120._4_1_ = (byte)((ulong)uStack_120 >> 0x20);
                    in_stack_fffffffffffffc84 = (uint)uStack_120._4_1_;
                    if (in_stack_fffffffffffffc84 == 3) {
                      local_161 = 1;
                    }
                    else if (in_stack_fffffffffffffc84 == 5) {
                      SDL_SetRenderDrawColor(local_40,0,0,0,0xff);
                      SDL_RenderFillRect(local_40,0);
                      local_161 = 1;
                    }
                  }
                  else if ((int)local_128 == 0x300) {
                    local_118._4_4_ = (int)((ulong)local_118 >> 0x20);
                    if (local_118._4_4_ == 0x1b) {
                      std::
                      unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                      ::operator->((unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                    *)0x10d9de);
                      std::atomic<bool>::operator=
                                ((atomic<bool> *)in_stack_fffffffffffffc50,
                                 SUB41((uint)in_stack_fffffffffffffc4c >> 0x18,0));
                      local_e0 = 1;
                    }
                    else {
                      bVar8 = local_118._4_4_ == 0x6e;
                      if (bVar8) {
                        std::
                        unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                        ::operator->((unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                      *)0x10da09);
                        std::atomic<bool>::operator=
                                  ((atomic<bool> *)in_stack_fffffffffffffc50,
                                   SUB41((uint)in_stack_fffffffffffffc4c >> 0x18,0));
                        local_e0 = 0;
                      }
                    }
                  }
                  else if ((int)local_128 == 0x8000) {
                    std::operator<<((ostream *)&std::cout,'\n');
                    local_170 = (rep)std::chrono::duration<long,_std::ratio<1L,_1L>_>::min();
                    local_e8 = local_170;
                    if (local_e0 == 1) {
LAB_0010dcf2:
                      std::
                      unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                      ::operator=(in_stack_fffffffffffffc50,
                                  (nullptr_t)
                                  CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
                      CloseAL();
                      SDL_DestroyRenderer(local_40);
                      local_40 = 0;
                      SDL_DestroyWindow();
                      local_30 = (SDL_Window *)0x0;
                      SDL_Quit();
                      exit(0);
                    }
                    std::
                    unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                    ::operator=(in_stack_fffffffffffffc50,
                                (nullptr_t)
                                CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
                    while( true ) {
                      in_stack_fffffffffffffc80 = in_stack_fffffffffffffc80 & 0xffffff;
                      if (local_ac < local_8) {
                        bVar8 = std::unique_ptr::operator_cast_to_bool
                                          ((unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                            *)0x10db35);
                        in_stack_fffffffffffffc80 =
                             CONCAT13(bVar8,(int3)in_stack_fffffffffffffc80) ^ 0xff000000;
                      }
                      if ((in_stack_fffffffffffffc80 & 0x1000000) == 0) break;
                      fname = (string *)operator_new(0x5c0);
                      lVar7 = (long)local_ac;
                      local_ac = local_ac + 1;
                      pcVar4 = (char *)local_10[lVar7];
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_198,pcVar4,&local_199);
                      anon_unknown.dwarf_f6f6::MovieState::MovieState
                                ((MovieState *)
                                 CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),fname
                                );
                      in_stack_fffffffffffffc50 = &local_178;
                      std::
                      unique_ptr<(anonymous_namespace)::MovieState,std::default_delete<(anonymous_namespace)::MovieState>>
                      ::unique_ptr<std::default_delete<(anonymous_namespace)::MovieState>,void>
                                (in_stack_fffffffffffffc50,
                                 (pointer)CONCAT44(in_stack_fffffffffffffc4c,
                                                   in_stack_fffffffffffffc48));
                      std::
                      unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                      ::operator=(in_stack_fffffffffffffc50,
                                  (unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                   *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
                      std::
                      unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                      ::~unique_ptr(in_stack_fffffffffffffc50);
                      std::__cxx11::string::~string(local_198);
                      std::allocator<char>::~allocator((allocator<char> *)&local_199);
                      std::
                      unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                      ::operator->((unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                    *)0x10dc28);
                      bVar8 = anon_unknown.dwarf_f6f6::MovieState::prepare
                                        (in_stack_fffffffffffffca8);
                      if (!bVar8) {
                        std::
                        unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                        ::operator=(in_stack_fffffffffffffc50,
                                    (nullptr_t)
                                    CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
                      }
                    }
                    bVar8 = std::unique_ptr::operator_cast_to_bool
                                      ((unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                        *)0x10dcc9);
                    if (!bVar8) goto LAB_0010dcf2;
                    std::
                    unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                    ::operator->((unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                  *)0x10dcdc);
                    anon_unknown.dwarf_f6f6::MovieState::setTitle
                              (in_stack_fffffffffffffd00,
                               (SDL_Window *)
                               CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
                  }
                  in_stack_fffffffffffffc4c = SDL_PollEvent(&local_128);
                  iVar2 = in_stack_fffffffffffffc4c;
                }
                std::
                unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                ::operator->((unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                              *)0x10dd81);
                anon_unknown.dwarf_f6f6::VideoState::updateVideo
                          (in_stack_fffffffffffffe28,screen_00,in_stack_fffffffffffffe18,
                           SUB81((ulong)lVar6 >> 0x38,0));
              } while( true );
            }
            poVar3 = std::operator<<((ostream *)&std::cerr,"Could not start a video");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          }
          else {
            poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to set up audio device");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          }
        }
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Could not initialize SDL - <<");
      pcVar4 = (char *)SDL_GetError();
      poVar3 = std::operator<<(poVar3,pcVar4);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  local_4 = 1;
  local_28 = 1;
  std::
  unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
  ::~unique_ptr(in_stack_fffffffffffffc50);
  return local_4;
}

Assistant:

int main(int argc, char *argv[])
{
    std::unique_ptr<MovieState> movState;

    if(argc < 2)
    {
        std::cerr<< "Usage: "<<argv[0]<<" [-device <device name>] [-direct] <files...>" <<std::endl;
        return 1;
    }
    /* Register all formats and codecs */
#if !(LIBAVFORMAT_VERSION_INT >= AV_VERSION_INT(58, 9, 100))
    av_register_all();
#endif
    /* Initialize networking protocols */
    avformat_network_init();

    if(SDL_Init(SDL_INIT_VIDEO | SDL_INIT_EVENTS))
    {
        std::cerr<< "Could not initialize SDL - <<"<<SDL_GetError() <<std::endl;
        return 1;
    }

    /* Make a window to put our video */
    SDL_Window *screen{SDL_CreateWindow(AppName.c_str(), 0, 0, 640, 480, SDL_WINDOW_RESIZABLE)};
    if(!screen)
    {
        std::cerr<< "SDL: could not set video mode - exiting" <<std::endl;
        return 1;
    }
    /* Make a renderer to handle the texture image surface and rendering. */
    Uint32 render_flags{SDL_RENDERER_ACCELERATED | SDL_RENDERER_PRESENTVSYNC};
    SDL_Renderer *renderer{SDL_CreateRenderer(screen, -1, render_flags)};
    if(renderer)
    {
        SDL_RendererInfo rinf{};
        bool ok{false};

        /* Make sure the renderer supports IYUV textures. If not, fallback to a
         * software renderer. */
        if(SDL_GetRendererInfo(renderer, &rinf) == 0)
        {
            for(Uint32 i{0u};!ok && i < rinf.num_texture_formats;i++)
                ok = (rinf.texture_formats[i] == SDL_PIXELFORMAT_IYUV);
        }
        if(!ok)
        {
            std::cerr<< "IYUV pixelformat textures not supported on renderer "<<rinf.name <<std::endl;
            SDL_DestroyRenderer(renderer);
            renderer = nullptr;
        }
    }
    if(!renderer)
    {
        render_flags = SDL_RENDERER_SOFTWARE | SDL_RENDERER_PRESENTVSYNC;
        renderer = SDL_CreateRenderer(screen, -1, render_flags);
    }
    if(!renderer)
    {
        std::cerr<< "SDL: could not create renderer - exiting" <<std::endl;
        return 1;
    }
    SDL_SetRenderDrawColor(renderer, 0, 0, 0, 255);
    SDL_RenderFillRect(renderer, nullptr);
    SDL_RenderPresent(renderer);

    /* Open an audio device */
    ++argv; --argc;
    if(InitAL(&argv, &argc))
    {
        std::cerr<< "Failed to set up audio device" <<std::endl;
        return 1;
    }

    {
        auto device = alcGetContextsDevice(alcGetCurrentContext());
        if(alcIsExtensionPresent(device, "ALC_SOFT_device_clock"))
        {
            std::cout<< "Found ALC_SOFT_device_clock" <<std::endl;
            alcGetInteger64vSOFT = reinterpret_cast<LPALCGETINTEGER64VSOFT>(
                alcGetProcAddress(device, "alcGetInteger64vSOFT")
            );
        }
    }

    if(alIsExtensionPresent("AL_SOFT_source_latency"))
    {
        std::cout<< "Found AL_SOFT_source_latency" <<std::endl;
        alGetSourcei64vSOFT = reinterpret_cast<LPALGETSOURCEI64VSOFT>(
            alGetProcAddress("alGetSourcei64vSOFT")
        );
    }
#ifdef AL_SOFT_events
    if(alIsExtensionPresent("AL_SOFT_events"))
    {
        std::cout<< "Found AL_SOFT_events" <<std::endl;
        alEventControlSOFT = reinterpret_cast<LPALEVENTCONTROLSOFT>(
            alGetProcAddress("alEventControlSOFT"));
        alEventCallbackSOFT = reinterpret_cast<LPALEVENTCALLBACKSOFT>(
            alGetProcAddress("alEventCallbackSOFT"));
    }
#endif
#ifdef AL_SOFT_callback_buffer
    if(alIsExtensionPresent("AL_SOFTX_callback_buffer"))
    {
        std::cout<< "Found AL_SOFT_callback_buffer" <<std::endl;
        alBufferCallbackSOFT = reinterpret_cast<LPALBUFFERCALLBACKSOFT>(
            alGetProcAddress("alBufferCallbackSOFT"));
    }
#endif

    int fileidx{0};
    for(;fileidx < argc;++fileidx)
    {
        if(strcmp(argv[fileidx], "-direct") == 0)
        {
            if(alIsExtensionPresent("AL_SOFT_direct_channels_remix"))
            {
                std::cout<< "Found AL_SOFT_direct_channels_remix" <<std::endl;
                DirectOutMode = AL_REMIX_UNMATCHED_SOFT;
            }
            else if(alIsExtensionPresent("AL_SOFT_direct_channels"))
            {
                std::cout<< "Found AL_SOFT_direct_channels" <<std::endl;
                DirectOutMode = AL_DROP_UNMATCHED_SOFT;
            }
            else
                std::cerr<< "AL_SOFT_direct_channels not supported for direct output" <<std::endl;
        }
        else if(strcmp(argv[fileidx], "-wide") == 0)
        {
            if(!alIsExtensionPresent("AL_EXT_STEREO_ANGLES"))
                std::cerr<< "AL_EXT_STEREO_ANGLES not supported for wide stereo" <<std::endl;
            else
            {
                std::cout<< "Found AL_EXT_STEREO_ANGLES" <<std::endl;
                EnableWideStereo = true;
            }
        }
        else if(strcmp(argv[fileidx], "-novideo") == 0)
            DisableVideo = true;
        else
            break;
    }

    while(fileidx < argc && !movState)
    {
        movState = std::unique_ptr<MovieState>{new MovieState{argv[fileidx++]}};
        if(!movState->prepare()) movState = nullptr;
    }
    if(!movState)
    {
        std::cerr<< "Could not start a video" <<std::endl;
        return 1;
    }
    movState->setTitle(screen);

    /* Default to going to the next movie at the end of one. */
    enum class EomAction {
        Next, Quit
    } eom_action{EomAction::Next};
    seconds last_time{seconds::min()};
    while(1)
    {
        SDL_Event event{};
        int have_evt{SDL_WaitEventTimeout(&event, 10)};

        auto cur_time = std::chrono::duration_cast<seconds>(movState->getMasterClock());
        if(cur_time != last_time)
        {
            auto end_time = std::chrono::duration_cast<seconds>(movState->getDuration());
            std::cout<< "    \r "<<PrettyTime{cur_time}<<" / "<<PrettyTime{end_time} <<std::flush;
            last_time = cur_time;
        }

        bool force_redraw{false};
        if(have_evt) do {
            switch(event.type)
            {
            case SDL_KEYDOWN:
                switch(event.key.keysym.sym)
                {
                case SDLK_ESCAPE:
                    movState->mQuit = true;
                    eom_action = EomAction::Quit;
                    break;

                case SDLK_n:
                    movState->mQuit = true;
                    eom_action = EomAction::Next;
                    break;

                default:
                    break;
                }
                break;

            case SDL_WINDOWEVENT:
                switch(event.window.event)
                {
                case SDL_WINDOWEVENT_RESIZED:
                    SDL_SetRenderDrawColor(renderer, 0, 0, 0, 255);
                    SDL_RenderFillRect(renderer, nullptr);
                    force_redraw = true;
                    break;

                case SDL_WINDOWEVENT_EXPOSED:
                    force_redraw = true;
                    break;

                default:
                    break;
                }
                break;

            case SDL_QUIT:
                movState->mQuit = true;
                eom_action = EomAction::Quit;
                break;

            case FF_MOVIE_DONE_EVENT:
                std::cout<<'\n';
                last_time = seconds::min();
                if(eom_action != EomAction::Quit)
                {
                    movState = nullptr;
                    while(fileidx < argc && !movState)
                    {
                        movState = std::unique_ptr<MovieState>{new MovieState{argv[fileidx++]}};
                        if(!movState->prepare()) movState = nullptr;
                    }
                    if(movState)
                    {
                        movState->setTitle(screen);
                        break;
                    }
                }

                /* Nothing more to play. Shut everything down and quit. */
                movState = nullptr;

                CloseAL();

                SDL_DestroyRenderer(renderer);
                renderer = nullptr;
                SDL_DestroyWindow(screen);
                screen = nullptr;

                SDL_Quit();
                exit(0);

            default:
                break;
            }
        } while(SDL_PollEvent(&event));

        movState->mVideo.updateVideo(screen, renderer, force_redraw);
    }

    std::cerr<< "SDL_WaitEvent error - "<<SDL_GetError() <<std::endl;
    return 1;
}